

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixxx.cc
# Opt level: O1

void __thiscall ixxx::socket::gai_foo::test_method(gai_foo *this)

{
  addrinfo *res;
  addrinfo hints;
  shared_count sStack_108;
  addrinfo *local_100;
  addrinfo local_f8 [2];
  char *local_98;
  char *local_90;
  undefined **local_88;
  undefined1 local_80;
  undefined8 *local_78;
  char *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  char *local_58;
  char *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  char *local_38;
  char *local_30;
  
  local_f8[0].ai_flags = 0;
  local_f8[0].ai_family = 0;
  local_f8[0].ai_canonname = (char *)0x0;
  local_f8[0].ai_next = (addrinfo *)0x0;
  local_f8[0].ai_addrlen = 0;
  local_f8[0]._20_4_ = 0;
  local_f8[0].ai_addr = (sockaddr *)0x0;
  local_f8[0].ai_socktype = 1;
  local_f8[0].ai_protocol = 0;
  local_100 = (addrinfo *)0x0;
  local_38 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/gsauthof[P]libixxx/unittest/ixxx.cc";
  local_30 = "";
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  local_40 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_38,0x102);
  posix::getaddrinfo("example.invalid","123",local_f8,&local_100);
  local_58 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/gsauthof[P]libixxx/unittest/ixxx.cc";
  local_50 = "";
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  local_60 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_58,0x102);
  sStack_108.pi_ = (sp_counted_base *)0x0;
  local_80 = 0;
  local_88 = &PTR__lazy_ostream_00124a60;
  local_78 = &boost::unit_test::lazy_ostream::inst;
  local_70 = "exception ixxx::sys_error expected but not raised";
  local_98 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/gsauthof[P]libixxx/unittest/ixxx.cc";
  local_90 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_108);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(gai_foo)
    {
        struct addrinfo hints = {
            .ai_family   = AF_UNSPEC,
            .ai_socktype = SOCK_STREAM
        };
        struct addrinfo *res = 0;
        BOOST_CHECK_EXCEPTION(ixxx::posix::getaddrinfo("example.invalid", "123", &hints, &res),
                ixxx::sys_error,
                [](const sys_error &e) { return !!strstr(e.what(), "not known"); }
                );

    }